

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLinActuator.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLinActuator::ChLinkLinActuator(ChLinkLinActuator *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChFunction *__tmp;
  
  ChLinkLockLock::ChLinkLockLock(&this->super_ChLinkLockLock);
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj._vptr_ChObj = &PTR__ChLinkLinActuator_00b1a1b0;
  (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->offset = 0.1;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  this_00 = (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ChLinkMaskLF::SetLockMask
            (&(this->super_ChLinkLockLock).super_ChLinkLock.mask,true,false,false,false,false,false,
             false);
  ChLinkLock::BuildLink((ChLinkLock *)this);
  return;
}

Assistant:

ChLinkLinActuator::ChLinkLinActuator() : offset(0.1) {
    dist_funct = chrono_types::make_shared<ChFunction_Const>(0);

    // Mask: initialize our LinkMaskLF (lock formulation mask)
    mask.SetLockMask(true, false, false, false, false, false, false);
    BuildLink();
}